

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skein.c
# Opt level: O0

int Skein1024_Init(Skein1024_Ctxt_t *ctx,size_t hashBitLen)

{
  u08b_t local_98 [8];
  anon_union_128_2_94730036 cfg;
  size_t hashBitLen_local;
  Skein1024_Ctxt_t *ctx_local;
  
  (ctx->h).hashBitLen = hashBitLen;
  cfg.w[0xf] = hashBitLen;
  hashBitLen_local = (size_t)ctx;
  if (hashBitLen == 0x180) {
    memcpy(ctx->X,SKEIN1024_IV_384,0x80);
  }
  else if (hashBitLen == 0x200) {
    memcpy(ctx->X,SKEIN1024_IV_512,0x80);
  }
  else if (hashBitLen == 0x400) {
    memcpy(ctx->X,SKEIN1024_IV_1024,0x80);
  }
  else {
    (ctx->h).T[0] = 0;
    (ctx->h).T[1] = 0xc400000000000000;
    (ctx->h).bCnt = 0;
    builtin_memcpy(local_98,"SHA3\x01",6);
    local_98[6] = '\0';
    local_98[7] = '\0';
    cfg.w[1] = 0;
    cfg.w[0] = hashBitLen;
    memset(cfg.b + 0x10,0,0x68);
    memset((void *)(hashBitLen_local + 0x20),0,0x80);
    Skein1024_Process_Block((Skein1024_Ctxt_t *)hashBitLen_local,local_98,1,0x20);
  }
  *(undefined8 *)(hashBitLen_local + 0x10) = 0;
  *(undefined8 *)(hashBitLen_local + 0x18) = 0x7000000000000000;
  *(undefined8 *)(hashBitLen_local + 8) = 0;
  return 0;
}

Assistant:

int Skein1024_Init(Skein1024_Ctxt_t *ctx, size_t hashBitLen)
{
    union
    {
        u08b_t  b[SKEIN1024_STATE_BYTES];
        u64b_t  w[SKEIN1024_STATE_WORDS];
    } cfg;                              /* config block */

    Skein_Assert(hashBitLen > 0,SKEIN_BAD_HASHLEN);
    ctx->h.hashBitLen = hashBitLen;         /* output hash bit count */

    switch (hashBitLen)
    {              /* use pre-computed values, where available */
    case  512:
        memcpy(ctx->X,SKEIN1024_IV_512 ,sizeof(ctx->X));
        break;
    case  384:
        memcpy(ctx->X,SKEIN1024_IV_384 ,sizeof(ctx->X));
        break;
    case 1024:
        memcpy(ctx->X,SKEIN1024_IV_1024,sizeof(ctx->X));
        break;
    default:
        /* here if there is no precomputed IV value available */
        /* build/process the config block, type == CONFIG (could be precomputed) */
        Skein_Start_New_Type(ctx,CFG_FINAL);        /* set tweaks: T0=0; T1=CFG | FINAL */

        cfg.w[0] = Skein_Swap64(SKEIN_SCHEMA_VER);  /* set the schema, version */
        cfg.w[1] = Skein_Swap64(hashBitLen);        /* hash result length in bits */
        cfg.w[2] = Skein_Swap64(SKEIN_CFG_TREE_INFO_SEQUENTIAL);
        memset(&cfg.w[3],0,sizeof(cfg) - 3*sizeof(cfg.w[0])); /* zero pad config block */

        /* compute the initial chaining values from config block */
        memset(ctx->X,0,sizeof(ctx->X));            /* zero the chaining variables */
        Skein1024_Process_Block(ctx,cfg.b,1,SKEIN_CFG_STR_LEN);
        break;
    }

    /* The chaining vars ctx->X are now initialized for the given hashBitLen. */
    /* Set up to process the data message portion of the hash (default) */
    Skein_Start_New_Type(ctx,MSG);              /* T0=0, T1= MSG type */

    return SKEIN_SUCCESS;
}